

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::verifyXFBData
          (FunctionalTest1_2 *this,void *xfb_data,_variable_type *variable_type)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  _variable_type _Var4;
  long lVar5;
  undefined8 extraout_RDX;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  undefined8 uVar6;
  _variable_type *variable_type_03;
  bool bVar7;
  uint uVar8;
  float fVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  string local_1f8;
  uint local_1d4;
  Utils *local_1d0;
  FunctionalTest1_2 *local_1c8;
  uint local_1c0;
  float local_1bc;
  double local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  local_1c8 = this;
  _Var4 = Utils::getBaseVariableType(variable_type);
  local_1d0 = (Utils *)variable_type;
  local_1d4 = Utils::getNumberOfComponentsForVariableType(variable_type);
  if (_Var4 == VARIABLE_TYPE_BOOL) {
    lVar5 = 0;
    bVar3 = true;
    bVar2 = true;
    do {
      bVar7 = bVar2;
      if (local_1d4 != 0) {
        uVar8 = local_1d4;
        do {
          if (*xfb_data != deqp::ShaderLoopTests::init::s_shaderTypes[lVar5]) {
            local_1b0 = (undefined1  [8])
                        ((local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
            ;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c);
            Utils::getVariableTypeGLSLString_abi_cxx11_(&local_1f8,local_1d0,variable_type_03);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," argument/return types (expected:[",0x22);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"], found:[",10)
            ;
            std::ostream::operator<<((ostringstream *)local_1a8,*xfb_data);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar3 = false;
            break;
          }
          xfb_data = (void *)((long)xfb_data + 4);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      lVar5 = 1;
      bVar2 = false;
    } while (bVar7);
  }
  else {
    uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    lVar5 = 0;
    bVar3 = true;
    do {
      local_1c0 = (uint)uVar6;
      if (local_1d4 != 0) {
        fVar1 = (float)(&DAT_01a60a00)[lVar5];
        local_1bc = (float)(uint)fVar1;
        local_1b8 = (double)(uint)fVar1;
        uVar8 = local_1d4;
        do {
          if ((int)_Var4 < 9) {
            if (_Var4 == VARIABLE_TYPE_DOUBLE) {
              dVar10 = *xfb_data - local_1b8;
              dVar12 = -dVar10;
              if (-dVar10 <= dVar10) {
                dVar12 = dVar10;
              }
              if (9.999999747378752e-06 < dVar12) {
                local_1b0 = (undefined1  [8])
                            ((local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c)
                ;
                Utils::getVariableTypeGLSLString_abi_cxx11_(&local_1f8,local_1d0,variable_type_02);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                           local_1f8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," argument/return types (expected:[",0x22);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"], found:[",10);
                std::ostream::_M_insert<double>(*xfb_data);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar3 = false;
              }
              xfb_data = (void *)((long)xfb_data + 8);
            }
            else if (_Var4 == VARIABLE_TYPE_FLOAT) {
              fVar9 = *xfb_data - local_1bc;
              fVar11 = -fVar9;
              if (-fVar9 <= fVar9) {
                fVar11 = fVar9;
              }
              if (1e-05 < fVar11) {
                local_1b0 = (undefined1  [8])
                            ((local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c)
                ;
                Utils::getVariableTypeGLSLString_abi_cxx11_(&local_1f8,local_1d0,variable_type_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                           local_1f8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," argument/return types (expected:[",0x22);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"], found:[",10);
                std::ostream::_M_insert<double>((double)*xfb_data);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                goto LAB_0097655f;
              }
              goto LAB_0097657a;
            }
          }
          else if ((_Var4 == VARIABLE_TYPE_INT) || (_Var4 == VARIABLE_TYPE_UINT)) {
            if (*xfb_data != fVar1) {
              local_1b0 = (undefined1  [8])
                          ((local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c);
              Utils::getVariableTypeGLSLString_abi_cxx11_(&local_1f8,local_1d0,variable_type_01);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," argument/return types (expected:[",0x22);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"], found:[",10);
              std::ostream::operator<<((ostringstream *)local_1a8,(int)*xfb_data);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
LAB_0097655f:
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              bVar3 = false;
            }
LAB_0097657a:
            xfb_data = (void *)((long)xfb_data + 4);
          }
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      lVar5 = 1;
      uVar6 = 0;
    } while ((local_1c0 & 1) != 0);
  }
  return bVar3;
}

Assistant:

bool FunctionalTest1_2::verifyXFBData(const void* xfb_data, const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type base_variable_type		   = Utils::getBaseVariableType(variable_type);
	const float					epsilon					   = 1e-5f;
	const unsigned int			n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	bool						result					   = true;
	const unsigned char*		traveller_ptr			   = (const unsigned char*)xfb_data;

	/* Boolean arguments/return types are tested with a slightly different shader so we
	 * need to test them in a separate code-path.
	 */
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* 0 should be returned when getter0 is used, 1 otherwise */
		const unsigned int ref_values[] = { 0, 1 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				int* result_value_ptr = (int*)(traveller_ptr);

				if (*result_value_ptr != (int)ref_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																   "["
									   << Utils::getVariableTypeGLSLString(variable_type) << "]"
									   << " argument/return types ("
										  "expected:["
									   << ref_value << "], found:[" << *result_value_ptr << "])"
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}

				traveller_ptr += sizeof(int);
			} /* for (all components) */
		}	 /* for (all reference values) */
	}		  /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
	else
	{
		/* 4 should be returned when getter0 is used, 5 otherwise */
		const unsigned int ref_values[] = { 4, 5 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			DE_ASSERT(
				base_variable_type == Utils::VARIABLE_TYPE_DOUBLE || base_variable_type == Utils::VARIABLE_TYPE_FLOAT ||
				base_variable_type == Utils::VARIABLE_TYPE_INT || base_variable_type == Utils::VARIABLE_TYPE_UINT);

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				const double* double_value_ptr = (double*)traveller_ptr;
				const float*  float_value_ptr  = (float*)traveller_ptr;
				const int*	int_value_ptr	= (int*)traveller_ptr;

				switch (base_variable_type)
				{
				case Utils::VARIABLE_TYPE_DOUBLE:
				{
					if (de::abs(*double_value_ptr - (double)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *double_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(double);
					break;
				}

				case Utils::VARIABLE_TYPE_FLOAT:
				{
					if (de::abs(*float_value_ptr - (float)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *float_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(float);
					break;
				}

				case Utils::VARIABLE_TYPE_INT:
				case Utils::VARIABLE_TYPE_UINT:
				{
					if (*int_value_ptr != (int)ref_value)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *int_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(int);
					break;
				}

				default:
					break;
				} /* switch (base_variable_type) */
			}	 /* for (all components) */
		}		  /* for (all reference values) */
	}

	return result;
}